

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O3

void __thiscall Js::ByteCodeCache::Initialize(ByteCodeCache *this,ScriptContext *scriptContext)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined8 in_RAX;
  undefined4 *puVar5;
  PropertyId *pPVar6;
  long lVar7;
  ByteCodeBufferReader *pBVar8;
  byte **ppbVar9;
  byte *buffer;
  byte *pbVar10;
  int iVar11;
  size_t requestedBytes;
  ulong uVar12;
  undefined8 uStack_38;
  int offset;
  
  iVar11 = this->reader->string16Count;
  this->propertyCount = iVar11;
  uStack_38 = in_RAX;
  if ((long)iVar11 == 0) {
    this->propertyIds = (PropertyId *)&DAT_00000008;
LAB_0086bb9e:
    pBVar8 = this->reader;
    this->raw = pBVar8->raw;
  }
  else {
    requestedBytes = 0xffffffffffffffff;
    if (-1 < iVar11) {
      requestedBytes = (long)iVar11 << 2;
    }
    BVar4 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar4 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar3) goto LAB_0086bcec;
      *puVar5 = 0;
    }
    pPVar6 = (PropertyId *)
             Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             AllocInternal(&(scriptContext->sourceCodeAllocator).
                            super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                           ,requestedBytes);
    if (pPVar6 == (PropertyId *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar3) goto LAB_0086bcec;
      *puVar5 = 0;
    }
    this->propertyIds = pPVar6;
    if (this->propertyCount < 1) goto LAB_0086bb9e;
    lVar7 = 0;
    do {
      pPVar6[lVar7] = -1;
      lVar7 = lVar7 + 1;
    } while (lVar7 < this->propertyCount);
    pBVar8 = this->reader;
    this->raw = pBVar8->raw;
    if (0 < this->propertyCount) {
      iVar11 = 0;
      do {
        PopulateLookupPropertyId(this,scriptContext,iVar11);
        iVar11 = iVar11 + 1;
      } while (iVar11 < this->propertyCount);
      pBVar8 = this->reader;
    }
  }
  uVar1 = pBVar8->scopeInfoCount;
  this->scopeInfoCount = uVar1;
  if ((ulong)uVar1 != 0) {
    BVar4 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar4 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar3) goto LAB_0086bcec;
      *puVar5 = 0;
    }
    ppbVar9 = (byte **)Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                       AllocInternal(&(scriptContext->sourceCodeAllocator).
                                      super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                     ,(ulong)uVar1 << 3);
    if (ppbVar9 == (byte **)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar3) {
LAB_0086bcec:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
    this->scopeInfoRelativeOffsets = ppbVar9;
    if (this->scopeInfoCount != 0) {
      buffer = this->reader->scopeInfoRelativeOffsets;
      uVar12 = 0;
      do {
        pBVar8 = this->reader;
        buffer = ByteCodeBufferReader::ReadConstantSizedInt32
                           (buffer,(size_t)(pBVar8->raw + ((long)pBVar8->totalSize - (long)buffer)),
                            (int *)((long)&uStack_38 + 4));
        pbVar10 = pBVar8->raw + uStack_38._4_4_;
        if ((long)uStack_38._4_4_ == 0) {
          pbVar10 = (byte *)0x0;
        }
        this->scopeInfoRelativeOffsets[uVar12] = pbVar10;
        uVar12 = uVar12 + 1;
      } while (uVar12 < this->scopeInfoCount);
    }
  }
  return;
}

Assistant:

void ByteCodeCache::Initialize(ScriptContext * scriptContext)
{
    auto alloc = scriptContext->SourceCodeAllocator();
    propertyCount = reader->string16Count;
    propertyIds = AnewArray(alloc, PropertyId, propertyCount);
    for (auto i = 0; i < propertyCount; ++i)
    {
        propertyIds[i] = -1;
    }

    raw = reader->raw;

    // Read and populate PropertyIds
    for (int i = 0; i < propertyCount; ++i)
    {
        PopulateLookupPropertyId(scriptContext, i);
    }

    scopeInfoCount = reader->scopeInfoCount;
    if (scopeInfoCount > 0)
    {
        scopeInfoRelativeOffsets = AnewArray(alloc, const byte*, scopeInfoCount);

        const byte* current = reader->scopeInfoRelativeOffsets;
        for (uint i = 0; i < scopeInfoCount; i++)
        {
            const byte* ptr = nullptr;
            current = reader->ReadOffsetAsPointer(current, &ptr);

            scopeInfoRelativeOffsets[i] = ptr;
        }
    }
}